

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  allocator<char> local_131;
  string local_130;
  Move<vk::Handle<(vk::HandleType)13>_> local_100;
  RefData<vk::Handle<(vk::HandleType)13>_> local_e0;
  undefined1 local_c0 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> obj;
  Resources res;
  Environment env;
  Context *context_local;
  
  this = (Environment *)
         &res.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator
  ;
  Environment::Environment(this,context,1);
  this_00 = &obj.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  ImageView::Resources::Resources((Resources *)this_00,this,&params);
  ImageView::create(&local_100,this,(Resources *)this_00,&params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
  data.object.m_internal = local_e0.object.m_internal;
  data.deleter.m_device = local_e0.deleter.m_device;
  data.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_c0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_100);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Ok",&local_131);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  ImageView::Resources::~Resources
            ((Resources *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}